

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderSwitchTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::ShaderSwitchTests::makeSwitchCases
          (ShaderSwitchTests *this,string *name,string *desc,LineStream *switchBody)

{
  TestContext *pTVar1;
  char *__rhs;
  long lVar2;
  char **ppcVar3;
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderSwitchCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderSwitchCase>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppcVar3 = makeSwitchCases::switchTypeNames;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
    std::operator+(&local_90,name,"_");
    __rhs = *ppcVar3;
    std::operator+(&local_50,&local_90,__rhs);
    std::operator+(&local_70,&local_50,"_vertex");
    makeSwitchCase(&local_a0,pTVar1,&local_70,desc,(SwitchType)lVar2,true,switchBody);
    tcu::TestNode::addChild
              ((TestNode *)this,
               (TestNode *)
               local_a0.
               super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderSwitchCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderSwitchCase>_>
               .m_data.ptr);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
    std::operator+(&local_90,name,"_");
    std::operator+(&local_50,&local_90,__rhs);
    std::operator+(&local_70,&local_50,"_fragment");
    makeSwitchCase(&local_a0,pTVar1,&local_70,desc,(SwitchType)lVar2,false,switchBody);
    tcu::TestNode::addChild
              ((TestNode *)this,
               (TestNode *)
               local_a0.
               super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderSwitchCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderSwitchCase>_>
               .m_data.ptr);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    ppcVar3 = ppcVar3 + 1;
  }
  return;
}

Assistant:

void ShaderSwitchTests::makeSwitchCases (const string& name, const string& desc, const LineStream& switchBody)
{
	static const char* switchTypeNames[] = { "static", "uniform", "dynamic" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(switchTypeNames) == SWITCHTYPE_LAST);

	for (int type = 0; type < SWITCHTYPE_LAST; type++)
	{
		addChild(makeSwitchCase(m_testCtx, (name + "_" + switchTypeNames[type] + "_vertex"),	desc, (SwitchType)type, true,	switchBody).release());
		addChild(makeSwitchCase(m_testCtx, (name + "_" + switchTypeNames[type] + "_fragment"),	desc, (SwitchType)type, false,	switchBody).release());
	}
}